

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_scalingFactorBetweenDissimilarUnits_Test::~Units_scalingFactorBetweenDissimilarUnits_Test
          (Units_scalingFactorBetweenDissimilarUnits_Test *this)

{
  Units_scalingFactorBetweenDissimilarUnits_Test *this_local;
  
  ~Units_scalingFactorBetweenDissimilarUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, scalingFactorBetweenDissimilarUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("metre", 0, 1.0, 1000.0);
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("metre", 0, 1.0, 1.0);
    u2->addUnit("metre", 0, 1.0, 1.0);
    u2->addUnit("metre", 0, 1.0, 1.0);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}